

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O1

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,ArrayAccessExpression *expression)

{
  pointer pcVar1;
  int iVar2;
  int index;
  Value *pVVar3;
  ArrayValue *this_00;
  string local_60;
  Symbol local_40;
  
  pVVar3 = TemplateVisitor<Value_*>::Accept
                     (&this->super_TemplateVisitor<Value_*>,
                      &expression->index_expression_->super_Node);
  iVar2 = (*pVVar3->_vptr_Value[2])(pVVar3);
  pcVar1 = (expression->array_indent_)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (expression->array_indent_)._M_string_length);
  Symbol::Symbol(&local_40,&local_60);
  index = FunctionTable::Get(&this->table_,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.name_._M_dataplus._M_p != &local_40.name_.field_2) {
    operator_delete(local_40.name_._M_dataplus._M_p,local_40.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pVVar3 = FrameEmulator::Get(&this->frame_,index);
  this_00 = (ArrayValue *)__dynamic_cast(pVVar3,&Value::typeinfo,&ArrayValue::typeinfo,0);
  pVVar3 = ArrayValue::AtIndex(this_00,(long)iVar2);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = pVVar3;
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(ArrayAccessExpression* expression) {
  int array_index = Accept(expression->index_expression_)->GetValue();
  int index = table_.Get(Symbol(expression->array_indent_));
  tos_value_ =
      dynamic_cast<ArrayValue*>(frame_.Get(index))->AtIndex(array_index);
}